

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O2

void __thiscall Messages::Person::Person(Person *this,Person *from)

{
  undefined1 *this_00;
  uint uVar1;
  Arena *pAVar2;
  
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined ***)this = &PTR__Person_00110ba8;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  this_00 = &this->field_0x8;
  google::protobuf::RepeatedPtrField<Messages::Person_PhoneNumber>::RepeatedPtrField
            (&this->phones_,&from->phones_);
  if ((*(ulong *)&from->field_0x8 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)this_00,
               (UnknownFieldSet *)((*(ulong *)&from->field_0x8 & 0xfffffffffffffffe) + 8));
  }
  (this->name_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    pAVar2 = *(Arena **)this_00;
    if (((ulong)pAVar2 & 1) != 0) {
      pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->name_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->name_).ptr_,pAVar2);
    uVar1 = (from->_has_bits_).has_bits_[0];
  }
  (this->email_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
  ;
  if ((uVar1 & 2) != 0) {
    pAVar2 = *(Arena **)this_00;
    if (((ulong)pAVar2 & 1) != 0) {
      pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->email_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->email_).ptr_,pAVar2);
  }
  this->id_ = from->id_;
  return;
}

Assistant:

Person::Person(const Person& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_),
      phones_(from.phones_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArena());
  }
  email_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_email()) {
    email_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_email(),
      GetArena());
  }
  id_ = from.id_;
  // @@protoc_insertion_point(copy_constructor:Messages.Person)
}